

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadInt32(ON_BinaryArchive *this,size_t count,ON__INT32 *p)

{
  ON__INT32 OVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  bool bVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  
  bVar6 = ReadByte(this,count * 4,p);
  if ((bVar6) && (this->m_endian == big_endian)) {
    for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
      OVar1 = p[sVar7];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  (byte)((uint)OVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)OVar1 >> 0x10),OVar1)) >>
                                                  0x20),OVar1) >> 0x18),
                                                  CONCAT12((char)((uint)OVar1 >> 8),(short)OVar1))
                                           >> 0x10),(short)OVar1) & 0xffff00ff00ff00ff;
      auVar8 = pshuflw(auVar8,auVar8,0x1b);
      sVar2 = auVar8._0_2_;
      sVar3 = auVar8._2_2_;
      sVar4 = auVar8._4_2_;
      sVar5 = auVar8._6_2_;
      p[sVar7] = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar8[6] - (0xff < sVar5),
                          CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar8[4] - (0xff < sVar4),
                                   CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar8[2] -
                                            (0xff < sVar3),
                                            (0 < sVar2) * (sVar2 < 0x100) * auVar8[0] -
                                            (0xff < sVar2))));
    }
  }
  return bVar6;
}

Assistant:

bool
ON_BinaryArchive::ReadInt32( // Read an array of 32 bit signed integers
		size_t count,            // number of 32 bit signed integers to read
		ON__INT32* p
		)
{
  bool rc = ReadByte( count<<2, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b= (unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[3]; b[3] = c;
			c = b[1]; b[1] = b[2]; b[2] = c;
			b += 4;
		}
  }
  return rc;
}